

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontProvider.cpp
# Opt level: O3

bool __thiscall
Rml::FontProvider::LoadFontFace
          (FontProvider *this,Span<const_unsigned_char> data,int face_index,bool fallback_face,
          UniquePtr<byte[]> *face_memory,String *source,String *font_family,FontStyle style,
          FontWeight weight)

{
  undefined2 uVar1;
  pointer pFVar2;
  bool bVar3;
  FontWeight FVar4;
  int iVar5;
  int iVar6;
  FontFaceHandleFreetype in_face;
  char *fmt;
  FaceVariation *pFVar7;
  FaceVariation *pFVar8;
  Span<const_unsigned_char> data_00;
  Vector<FaceVariation> face_variations;
  String font_face_description;
  _Head_base<0UL,_unsigned_char_*,_false> local_b0;
  vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> local_a8;
  uint local_8c;
  Vector<FaceVariation> local_88;
  String local_70;
  UniquePtr<byte[]> *local_50;
  FontProvider *local_48;
  FreeType *local_40;
  uchar *local_38;
  
  local_38 = (uchar *)data.m_size;
  local_40 = (FreeType *)data.m_data;
  local_88.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
  super__Vector_impl_data._M_start = (FaceVariation *)0x0;
  local_88.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
  super__Vector_impl_data._M_finish = (FaceVariation *)0x0;
  local_88.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8c = face_index;
  local_50 = face_memory;
  local_48 = this;
  bVar3 = FreeType::GetFaceVariations(data,&local_88,face_index);
  if (bVar3) {
    local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
    super__Vector_impl_data._M_start = (FaceVariation *)0x0;
    local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
    super__Vector_impl_data._M_finish = (FaceVariation *)0x0;
    local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (FaceVariation *)0x0;
    if (local_88.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_88.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      local_70._M_dataplus._M_p = (pointer)0x0;
      ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::
      emplace_back<Rml::FaceVariation>(&local_a8,(FaceVariation *)&local_70);
    }
    else {
      pFVar7 = local_88.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        FVar4 = pFVar7->weight;
        if ((weight == Auto) || (FVar4 == weight)) {
          iVar5 = Math::Absolute(pFVar7->width - 100);
          pFVar8 = pFVar7 + 1;
          if (pFVar8 != local_88.
                        super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            do {
              if (pFVar8->weight != FVar4) break;
              iVar6 = Math::Absolute(pFVar8->width - 100);
              if (iVar6 < iVar5) {
                iVar5 = iVar6;
                pFVar7 = pFVar8;
              }
              pFVar8 = pFVar8 + 1;
            } while (pFVar8 != local_88.
                               super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<Rml::FaceVariation,std::allocator<Rml::FaceVariation>>::
            _M_realloc_insert<Rml::FaceVariation_const&>
                      ((vector<Rml::FaceVariation,std::allocator<Rml::FaceVariation>> *)&local_a8,
                       (iterator)
                       local_a8.
                       super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
                       _M_impl.super__Vector_impl_data._M_finish,pFVar7);
            pFVar7 = pFVar8;
          }
          else {
            *local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
             _M_impl.super__Vector_impl_data._M_finish = *pFVar7;
            local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_a8.
                 super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
            pFVar7 = pFVar8;
          }
        }
        else {
          pFVar7 = pFVar7 + 1;
        }
      } while (pFVar7 != local_88.
                         super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pFVar2 = local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pFVar7 = local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      bVar3 = false;
      Log::Message(LT_ERROR,
                   "Failed to load font face from \'%s\': Could not locate face with weight %d.",
                   (source->_M_dataplus)._M_p,(ulong)weight);
    }
    else {
      do {
        data_00.m_size = (size_t)source;
        data_00.m_data = local_38;
        in_face = FreeType::LoadFace(local_40,data_00,(String *)(ulong)local_8c,
                                     pFVar7->named_instance_index,(int)face_memory);
        if (in_face == 0) {
LAB_002cb9e0:
          bVar3 = false;
          goto LAB_002cba04;
        }
        if (font_family->_M_string_length == 0) {
          FreeType::GetFaceStyle(in_face,font_family,&style,(FontWeight *)0x0);
        }
        if (weight == Auto) {
          FreeType::GetFaceStyle(in_face,(String *)0x0,(FontStyle *)0x0,&weight);
        }
        uVar1 = pFVar7->weight;
        FVar4 = weight;
        if (uVar1 != Auto) {
          FVar4 = uVar1;
        }
        GetFontFaceDescription(&local_70,font_family,style,FVar4);
        local_b0._M_head_impl =
             (local_50->_M_t).
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        (local_50->_M_t).super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
        ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
        face_memory = (UniquePtr<byte[]> *)(ulong)fallback_face;
        bVar3 = AddFace(local_48,in_face,font_family,style,FVar4,fallback_face,
                        (UniquePtr<byte[]> *)&local_b0);
        if (local_b0._M_head_impl != (uchar *)0x0) {
          operator_delete__(local_b0._M_head_impl);
        }
        local_b0._M_head_impl = (uchar *)0x0;
        fmt = "Failed to load font face %s from \'%s\'.";
        if (bVar3) {
          fmt = "Loaded font face %s from \'%s\'.";
        }
        Log::Message((uint)bVar3 + (uint)bVar3 * 2 + LT_ERROR,fmt,local_70._M_dataplus._M_p,
                     (source->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) goto LAB_002cb9e0;
        pFVar7 = pFVar7 + 1;
      } while (pFVar7 != pFVar2);
      bVar3 = true;
    }
LAB_002cba04:
    if (local_a8.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl
        .super__Vector_impl_data._M_start != (FaceVariation *)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar3 = false;
    Log::Message(LT_ERROR,
                 "Failed to load font face from \'%s\': Invalid or unsupported font face file format."
                 ,(source->_M_dataplus)._M_p);
  }
  if (local_88.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
      super__Vector_impl_data._M_start != (FaceVariation *)0x0) {
    operator_delete(local_88.
                    super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool FontProvider::LoadFontFace(Span<const byte> data, int face_index, bool fallback_face, UniquePtr<byte[]> face_memory, const String& source, String font_family,
	Style::FontStyle style, Style::FontWeight weight)
{
	using Style::FontWeight;

	Vector<FaceVariation> face_variations;
	if (!FreeType::GetFaceVariations(data, face_variations, face_index))
	{
		Log::Message(Log::LT_ERROR, "Failed to load font face from '%s': Invalid or unsupported font face file format.", source.c_str());
		return false;
	}

	Vector<FaceVariation> load_variations;
	if (face_variations.empty())
	{
		load_variations.push_back(FaceVariation{Style::FontWeight::Auto, 0, 0});
	}
	else
	{
		// Iterate through all the face variations and pick the ones to load. The list is already sorted by (weight, width). When weight is set to
		// 'auto' we load all the weights of the face. However, we only want to load one width for each weight.
		for (auto it = face_variations.begin(); it != face_variations.end();)
		{
			if (weight != FontWeight::Auto && it->weight != weight)
			{
				++it;
				continue;
			}

			// We don't currently have any way for users to select widths, so we search for a regular (medium) value here.
			constexpr int search_width = 100;
			const FontWeight current_weight = it->weight;

			int best_width_distance = Math::Absolute((int)it->width - search_width);
			auto it_best_width = it;

			// Search forward to find the best 'width' with the same weight.
			for (++it; it != face_variations.end(); ++it)
			{
				if (it->weight != current_weight)
					break;

				const int width_distance = Math::Absolute((int)it->width - search_width);
				if (width_distance < best_width_distance)
				{
					best_width_distance = width_distance;
					it_best_width = it;
				}
			}

			load_variations.push_back(*it_best_width);
		}
	}

	if (load_variations.empty())
	{
		Log::Message(Log::LT_ERROR, "Failed to load font face from '%s': Could not locate face with weight %d.", source.c_str(), (int)weight);
		return false;
	}

	for (const FaceVariation& variation : load_variations)
	{
		FontFaceHandleFreetype ft_face = FreeType::LoadFace(data, source, face_index, variation.named_instance_index);
		if (!ft_face)
			return false;

		if (font_family.empty())
			FreeType::GetFaceStyle(ft_face, &font_family, &style, nullptr);
		if (weight == FontWeight::Auto)
			FreeType::GetFaceStyle(ft_face, nullptr, nullptr, &weight);

		const FontWeight variation_weight = (variation.weight == FontWeight::Auto ? weight : variation.weight);
		const String font_face_description = GetFontFaceDescription(font_family, style, variation_weight);

		if (!AddFace(ft_face, font_family, style, variation_weight, fallback_face, std::move(face_memory)))
		{
			Log::Message(Log::LT_ERROR, "Failed to load font face %s from '%s'.", font_face_description.c_str(), source.c_str());
			return false;
		}

		Log::Message(Log::LT_INFO, "Loaded font face %s from '%s'.", font_face_description.c_str(), source.c_str());
	}

	return true;
}